

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c0_compile_semantic_analysis.cpp
# Opt level: O0

compile_errcode __thiscall ConditionStatement::Action(ConditionStatement *this)

{
  SymbolName SVar1;
  compile_errcode cVar2;
  int iVar3;
  Statement *pSVar4;
  int local_20;
  SymbolName name;
  int state;
  int ret;
  ConditionStatement *this_local;
  
  local_20 = 0;
  pSVar4 = (Statement *)operator_new(0x1e8);
  Statement::Statement(pSVar4);
  this->m_statement_ptr = pSVar4;
  do {
    SVar1 = SymbolQueue::GetCurrentName(handle_correct_queue);
    switch(local_20) {
    case 0:
      if (SVar1 != IF_SYM) {
LAB_001945bf:
        pSVar4 = this->m_statement_ptr;
        if (pSVar4 != (Statement *)0x0) {
          Statement::~Statement(pSVar4);
          operator_delete(pSVar4);
        }
        return -1;
      }
      local_20 = 1;
      break;
    case 1:
      if (SVar1 != L_CIRCLE_BRACKET_SYM) goto LAB_001945bf;
      local_20 = 2;
      break;
    case 2:
      cVar2 = Condition::Action(&this->m_condition);
      if (cVar2 != 0) goto LAB_001945bf;
      Condition::LogOutput(&this->m_condition);
      local_20 = 3;
      break;
    case 3:
      if (SVar1 != R_CIRCLE_BRACKET_SYM) goto LAB_001945bf;
      local_20 = 4;
      break;
    case 4:
      iVar3 = (*(this->m_statement_ptr->super_AnalysisInterface)._vptr_AnalysisInterface[2])();
      if (iVar3 != 0) goto LAB_001945bf;
      (*(this->m_statement_ptr->super_AnalysisInterface)._vptr_AnalysisInterface[1])();
      local_20 = 5;
      break;
    case 5:
      pSVar4 = this->m_statement_ptr;
      if (pSVar4 != (Statement *)0x0) {
        Statement::~Statement(pSVar4);
        operator_delete(pSVar4);
      }
      return 0;
    }
    if ((local_20 != 3) && (local_20 != 5)) {
      SymbolQueue::NextSymbol(handle_correct_queue);
    }
  } while( true );
}

Assistant:

compile_errcode ConditionStatement::Action() {
    int ret = COMPILE_OK;
    int state = 0;
    m_statement_ptr = new Statement;
    while (true) {
        SymbolName name = handle_correct_queue->GetCurrentName();
        switch (state) {
            case 0: {
                if (name == IF_SYM) {
                    state = 1;
                    break;
                } else {
                    goto ERROR_IF;
                }
            }
            case 1: {
                if (name == L_CIRCLE_BRACKET_SYM) {
                    state = 2;
                    break;
                } else {
                    goto ERROR_IF;
                }
            }
            case 2: {
                if ((ret = m_condition.Action()) == COMPILE_OK) {
                    m_condition.LogOutput();
                    state = 3;
                    break;
                } else {
                    goto ERROR_IF;
                }
            }
            case 3: {
                if (name == R_CIRCLE_BRACKET_SYM) {
                    state = 4;
                    break;
                } else {
                    goto ERROR_IF;
                }
            }
            case 4: {
                if ((ret = m_statement_ptr->Action()) == COMPILE_OK) {
                    m_statement_ptr->LogOutput();
                    state = 5;
                    break;
                } else {
                    goto ERROR_IF;
                }
            }
            case 5: goto CORRECT_IF;
        }
        if (state != 3 && state != 5)
            handle_correct_queue->NextSymbol();
    }
    CORRECT_IF:
        delete(m_statement_ptr);
        return COMPILE_OK;
    ERROR_IF:
        delete(m_statement_ptr);
        return NOT_MATCH;
}